

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lyd_parser_check_schema(lyd_ctx *lydctx,lysc_node *snode)

{
  uint16_t nodetype;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  LY_ERR LVar4;
  ly_ctx *plVar5;
  char *pcVar6;
  
  ly_log_location(snode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  uVar1 = lydctx->int_opts;
  LVar4 = LY_SUCCESS;
  if ((uVar1 & 0x10) != 0) goto LAB_00161412;
  if (((lydctx->parse_opts & 0x80000) == 0) || ((snode->flags & 2) == 0)) {
    nodetype = snode->nodetype;
    if (nodetype == 0x400) {
      uVar1 = uVar1 & 8;
    }
    else if (nodetype == 0x200) {
      uVar1 = uVar1 & 6;
    }
    else {
      if (nodetype != 0x100) goto LAB_00161412;
      uVar1 = uVar1 & 5;
    }
    if (uVar1 == 0) {
      plVar5 = lydctx->data_ctx->ctx;
      pcVar2 = lys_nodetype2str(nodetype);
      pcVar6 = snode->name;
      pcVar3 = "Unexpected %s element \"%s\".";
      goto LAB_00161408;
    }
    LVar4 = LY_SUCCESS;
    if (lydctx->op_node == (lyd_node *)0x0) goto LAB_00161412;
    plVar5 = lydctx->data_ctx->ctx;
    pcVar2 = lys_nodetype2str(nodetype);
    pcVar6 = snode->name;
    pcVar3 = lys_nodetype2str(lydctx->op_node->schema->nodetype);
    ly_vlog(plVar5,(char *)0x0,LYVE_DATA,"Unexpected %s element \"%s\", %s \"%s\" already parsed.",
            pcVar2,pcVar6,pcVar3,lydctx->op_node->schema->name);
  }
  else {
    plVar5 = lydctx->data_ctx->ctx;
    pcVar6 = snode->name;
    pcVar3 = "Unexpected data %s node \"%s\" found.";
    pcVar2 = "state";
LAB_00161408:
    ly_vlog(plVar5,(char *)0x0,LYVE_DATA,pcVar3,pcVar2,pcVar6);
  }
  LVar4 = LY_EVALID;
LAB_00161412:
  ly_log_location_revert(1,0,0,0);
  return LVar4;
}

Assistant:

LY_ERR
lyd_parser_check_schema(struct lyd_ctx *lydctx, const struct lysc_node *snode)
{
    LY_ERR rc = LY_SUCCESS;

    LOG_LOCSET(snode, NULL);

    if (lydctx->int_opts & LYD_INTOPT_ANY) {
        /* nothing to check, everything is allowed */
        goto cleanup;
    }

    if ((lydctx->parse_opts & LYD_PARSE_NO_STATE) && (snode->flags & LYS_CONFIG_R)) {
        LOGVAL(lydctx->data_ctx->ctx, LY_VCODE_UNEXPNODE, "state", snode->name);
        rc = LY_EVALID;
        goto cleanup;
    }

    if (snode->nodetype == LYS_RPC) {
        if (lydctx->int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_REPLY)) {
            if (lydctx->op_node) {
                goto error_node_dup;
            }
        } else {
            goto error_node_inval;
        }
    } else if (snode->nodetype == LYS_ACTION) {
        if (lydctx->int_opts & (LYD_INTOPT_ACTION | LYD_INTOPT_REPLY)) {
            if (lydctx->op_node) {
                goto error_node_dup;
            }
        } else {
            goto error_node_inval;
        }
    } else if (snode->nodetype == LYS_NOTIF) {
        if (lydctx->int_opts & LYD_INTOPT_NOTIF) {
            if (lydctx->op_node) {
                goto error_node_dup;
            }
        } else {
            goto error_node_inval;
        }
    }

    /* success */
    goto cleanup;

error_node_dup:
    LOGVAL(lydctx->data_ctx->ctx, LYVE_DATA, "Unexpected %s element \"%s\", %s \"%s\" already parsed.",
            lys_nodetype2str(snode->nodetype), snode->name, lys_nodetype2str(lydctx->op_node->schema->nodetype),
            lydctx->op_node->schema->name);
    rc = LY_EVALID;
    goto cleanup;

error_node_inval:
    LOGVAL(lydctx->data_ctx->ctx, LYVE_DATA, "Unexpected %s element \"%s\".", lys_nodetype2str(snode->nodetype),
            snode->name);
    rc = LY_EVALID;

cleanup:
    LOG_LOCBACK(1, 0);
    return rc;
}